

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

error_code __thiscall libtorrent::aux::torrent::initialize_merkle_trees(torrent *this)

{
  pointer *ppmVar1;
  undefined8 *puVar2;
  torrent_info *this_00;
  long lVar3;
  void *pvVar4;
  iterator __position;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>> *pvVar7;
  void *pvVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  undefined7 extraout_var;
  file_storage *this_01;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar12;
  int64_t iVar13;
  byte bVar14;
  long lVar15;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> sVar16;
  file_index_t index;
  span<const_char> piece_layer;
  error_code eVar17;
  error_code eVar18;
  byte local_ac;
  ulong local_a8;
  ulong local_a0;
  undefined8 local_98;
  int local_88;
  int local_84;
  vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>> *local_80;
  char *local_78;
  void *pvStack_70;
  undefined8 local_68;
  long lStack_60;
  void *local_58;
  undefined8 uStack_50;
  error_category *local_48;
  torrent *local_40;
  ulong local_38;
  
  bVar9 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
  local_a8 = CONCAT71(extraout_var,bVar9);
  if (bVar9) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    eVar17 = (error_code)(auVar6 << 0x40);
    bVar14 = 0;
  }
  else {
    this_00 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_ac = (this_00->m_flags).m_val >> 4;
    this_01 = torrent_info::orig_files(this_00);
    iVar11 = file_storage::num_files(this_01);
    ::std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::
    reserve(&(this->m_merkle_trees).
             super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
            ,(long)iVar11);
    iVar12 = file_storage::file_range(this_01);
    local_a8 = (ulong)iVar12 >> 0x20;
    eVar17.cat_ = local_48;
    eVar17.val_ = (int)local_a8;
    eVar17.failed_ = (bool)(char)(local_a8 >> 0x20);
    eVar17._5_3_ = (int3)(local_a8 >> 0x28);
    sVar16 = iVar12._begin.m_val;
    bVar9 = sVar16.m_val == iVar12._end.m_val.m_val;
    local_a0 = local_a8;
    local_38 = local_a8;
    if (!bVar9) {
      local_a0 = (long)sVar16.m_val * 0x10;
      eVar17._0_8_ = local_a0;
      lVar15 = (long)sVar16.m_val * 0x30;
      local_a8 = local_a0;
      local_80 = (vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>
                  *)&this->m_merkle_trees;
      local_40 = this;
      do {
        local_48 = eVar17.cat_;
        local_98 = eVar17._0_8_;
        index.m_val = (int)iVar12._begin.m_val;
        bVar10 = file_storage::pad_file_at(this_01,index);
        if ((bVar10) || (iVar13 = file_storage::file_size(this_01,index), iVar13 == 0)) {
          __position._M_current =
               (this->m_merkle_trees).
               super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
               .
               super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_merkle_trees).
              super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
              .
              super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::
            vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::
            _M_realloc_insert<>((vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                 *)local_80,__position);
          }
          else {
            ((__position._M_current)->m_block_verified).m_buf.
            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false> =
                 (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
            (__position._M_current)->m_num_blocks = 0;
            (__position._M_current)->m_blocks_per_piece_log = '\0';
            (__position._M_current)->m_mode = uninitialized_tree;
            *(undefined2 *)&(__position._M_current)->field_0x2e = 0;
            ((__position._M_current)->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((__position._M_current)->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__position._M_current)->m_root = (char *)0x0;
            ((__position._M_current)->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ppmVar1 = &(this->m_merkle_trees).
                       super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                       .
                       super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppmVar1 = *ppmVar1 + 1;
          }
          eVar17.cat_ = local_48;
          eVar17.val_ = (undefined4)local_98;
          eVar17.failed_ = (bool)local_98._4_1_;
          eVar17._5_3_ = local_98._5_3_;
          iVar11 = 3;
        }
        else {
          local_84 = file_storage::file_num_blocks(this_01,index);
          local_88 = file_storage::blocks_per_piece(this_01);
          local_78 = file_storage::root_ptr(this_01,index);
          pvVar7 = local_80;
          ::std::vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>::
          emplace_back<int,int,char_const*>(local_80,&local_84,&local_88,&local_78);
          piece_layer = torrent_info::piece_layer
                                  ((this->super_torrent_hot_members).m_torrent_file.
                                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,index);
          iVar11 = 0;
          if (piece_layer.m_len == 0) {
            iVar11 = 3;
            local_ac = 0;
          }
          else {
            bVar10 = merkle_tree::load_piece_layer
                               ((merkle_tree *)(*(long *)pvVar7 + lVar15),piece_layer);
            if (!bVar10) {
              local_58 = (void *)0x0;
              uStack_50 = 0;
              local_68 = 0;
              lStack_60 = 0;
              local_78 = (char *)0x0;
              pvStack_70 = (void *)0x0;
              lVar3 = *(long *)pvVar7;
              puVar2 = (undefined8 *)(lVar3 + lVar15);
              *puVar2 = 0;
              ::std::
              vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
              _M_move_assign((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              *)(puVar2 + 1));
              pvVar8 = local_58;
              local_58 = (void *)0x0;
              pvVar4 = (void *)puVar2[4];
              puVar2[4] = pvVar8;
              if (pvVar4 != (void *)0x0) {
                operator_delete__(pvVar4);
              }
              *(undefined2 *)(lVar3 + 0x2c + lVar15) = uStack_50._4_2_;
              *(undefined4 *)(lVar3 + 0x28 + lVar15) = (undefined4)uStack_50;
              if (local_58 != (void *)0x0) {
                operator_delete__(local_58);
              }
              this = local_40;
              local_58 = (void *)0x0;
              if (pvStack_70 != (void *)0x0) {
                operator_delete(pvStack_70,lStack_60 - (long)pvStack_70);
              }
              this->field_0x5db = this->field_0x5db & 0xf7;
              eVar17 = errors::make_error_code(torrent_invalid_piece_layer);
              local_a0 = eVar17._0_8_ >> 0x20;
              local_a8 = eVar17._0_8_ >> 0x28;
              iVar11 = 1;
              goto LAB_00315d0d;
            }
          }
          eVar17.cat_ = local_48;
          eVar17.val_ = (undefined4)local_98;
          eVar17.failed_ = (bool)local_98._4_1_;
          eVar17._5_3_ = local_98._5_3_;
        }
LAB_00315d0d:
        if ((iVar11 != 3) && (iVar11 != 0)) break;
        iVar12._begin.m_val = index.m_val + 1;
        iVar12._end.m_val = 0;
        lVar15 = lVar15 + 0x30;
        bVar9 = (uint)local_38 == iVar12._begin.m_val;
      } while (!bVar9);
    }
    local_48 = eVar17.cat_;
    if (bVar9) {
      *(uint *)&this->field_0x5d8 =
           *(uint *)&this->field_0x5d8 & 0xf7ffffff | (uint)(local_ac & 1) << 0x1b;
      torrent_info::free_piece_layers
                ((this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar14 = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
      eVar17 = (error_code)(auVar5 << 0x40);
    }
    else {
      bVar14 = (byte)local_a0;
    }
  }
  eVar18.cat_ = eVar17.cat_;
  eVar18._0_8_ = eVar17._0_8_ & 0xffffffff | (ulong)bVar14 << 0x20 | local_a8 << 0x28;
  return eVar18;
}

Assistant:

error_code torrent::initialize_merkle_trees()
	{
		if (!info_hash().has_v2()) return {};

		bool valid = m_torrent_file->v2_piece_hashes_verified();

		file_storage const& fs = m_torrent_file->orig_files();
		m_merkle_trees.reserve(fs.num_files());
		for (file_index_t i : fs.file_range())
		{
			if (fs.pad_file_at(i) || fs.file_size(i) == 0)
			{
				m_merkle_trees.emplace_back();
				continue;
			}
			m_merkle_trees.emplace_back(fs.file_num_blocks(i)
				, fs.blocks_per_piece(), fs.root_ptr(i));
			auto const piece_layer = m_torrent_file->piece_layer(i);
			if (piece_layer.empty())
			{
				valid = false;
				continue;
			}

			if (!m_merkle_trees[i].load_piece_layer(piece_layer))
			{
				m_merkle_trees[i] = aux::merkle_tree();
				m_v2_piece_layers_validated = false;
				return errors::torrent_invalid_piece_layer;
			}
		}

		m_v2_piece_layers_validated = valid;

		m_torrent_file->free_piece_layers();
		return {};
	}